

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O1

DS_STATUS ds_list_append(DsList *list,void *data)

{
  DsListEntry *pDVar1;
  DS_STATUS DVar2;
  DsListEntry *pDVar3;
  DsListEntry *pDVar4;
  
  if (list != (DsList *)0x0) {
    pDVar3 = (DsListEntry *)malloc(0x18);
    if (pDVar3 == (DsListEntry *)0x0) {
      DVar2 = DS_STATUS_OUTMEM;
    }
    else {
      pDVar3->data = data;
      pDVar3->next = (DsListEntry *)0x0;
      pDVar3->prev = (DsListEntry *)0x0;
      pDVar1 = list->entry;
      if (list->entry == (DsListEntry *)0x0) {
        list->entry = pDVar3;
      }
      else {
        do {
          pDVar4 = pDVar1;
          pDVar1 = pDVar4->next;
        } while (pDVar4->next != (DsListEntry *)0x0);
        pDVar4->next = pDVar3;
        pDVar3->next = (DsListEntry *)0x0;
        pDVar3->prev = pDVar4;
      }
      list->size = list->size + 1;
      DVar2 = DS_STATUS_OK;
    }
    return DVar2;
  }
  return DS_STATUS_NULL;
}

Assistant:

DS_STATUS ds_list_append(DsList *list, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->next = NULL;
    in->prev = NULL;

    if (DS_STATUS_OK != ds_entry_append(&list->entry, in))
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}